

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O3

data * __thiscall
mini_bus::
MiniBusPacketDecoder<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::decode(data *__return_storage_ptr__,
        MiniBusPacketDecoder<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
        *this)

{
  undefined8 *puVar1;
  anon_union_12_2_0c950b15 u;
  undefined8 local_98;
  uchar local_90;
  size_type local_88;
  system_error_category *psStack_80;
  undefined4 local_78;
  uint uStack_74;
  system_error_category *psStack_70;
  undefined1 local_68 [24];
  undefined1 auStack_50 [16];
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined1 *local_28;
  undefined8 local_20;
  
  local_28 = (undefined1 *)&local_98;
  local_68._0_8_ = &local_28;
  local_20 = 9;
  local_78 = 0;
  uStack_74 = uStack_74 & 0xffffff00;
  psStack_70 = &boost::system::detail::cat_holder<void>::system_category_instance;
  boost::asio::detail::
  read_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t>
            (this->stream,local_68._0_8_,local_68,&local_78);
  if ((char)uStack_74 != '\x01') {
    decode_body((MiniBusPacket *)local_68,this,local_90);
    __return_storage_ptr__->rid = (undefined4)local_98;
    __return_storage_ptr__->type = local_98._4_4_;
    (__return_storage_ptr__->pkt).is_ok = (bool)local_68[0];
    (__return_storage_ptr__->pkt).m_payload.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if (local_40._0_1_ == true) {
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->pkt).m_payload.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->pkt).m_payload.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload = puVar1;
      if ((undefined1 *)local_68._8_8_ == auStack_50) {
        *puVar1 = auStack_50._0_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->pkt).m_payload.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x18) = auStack_50._8_8_;
      }
      else {
        (__return_storage_ptr__->pkt).m_payload.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (pointer)local_68._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->pkt).m_payload.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x10) = auStack_50._0_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->pkt).m_payload.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload + 8) = local_68._16_8_;
      (__return_storage_ptr__->pkt).m_payload.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = true;
    }
    return __return_storage_ptr__;
  }
  local_88 = CONCAT44(uStack_74,local_78);
  psStack_80 = psStack_70;
  std::runtime_error::runtime_error((runtime_error *)local_68,"read");
  local_68._0_8_ = &PTR__system_error_0011cb80;
  local_68._16_8_ = local_88;
  auStack_50._0_8_ = psStack_80;
  auStack_50._8_8_ = &local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  boost::throw_exception<boost::system::system_error>((system_error *)local_68);
}

Assistant:

inline data decode() {
    union {
      char buffer[9];
      struct {
        uint32_t rid;
        uint32_t type;
        unsigned char flag;
      };
    } u;
    details::read_exactly(stream, u.buffer);
    auto body = decode_body(u.flag);
    return {u.rid, u.type, std::move(body)};
  }